

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int io_file_read(lua_State *L,FILE *fp,int start)

{
  byte bVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  size_t sVar9;
  GCstr *pGVar10;
  ulong uVar11;
  int iVar12;
  MSize MVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  TValue local_38;
  
  pTVar2 = L->top;
  pTVar3 = L->base;
  clearerr((FILE *)fp);
  iVar12 = (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) - start;
  if (iVar12 == 0) {
    uVar5 = io_file_readline(L,fp,1);
    uVar11 = (ulong)(start + 1);
  }
  else {
    luaL_checkstack(L,iVar12 + 0x14,"too many arguments");
    uVar11 = (ulong)start;
    uVar5 = 1;
    do {
      uVar14 = *(uint *)((long)L->base + uVar11 * 8 + 4);
      iVar6 = (int)uVar11;
      if (uVar14 == 0xfffffffb) {
        uVar7 = (ulong)L->base[uVar11].u32.lo;
        if (*(char *)(uVar7 + 0x10) != '*') {
LAB_0014653d:
          lj_err_arg(L,iVar6 + 1,LJ_ERR_INVOPT);
        }
        bVar1 = *(byte *)(uVar7 + 0x11);
        if (bVar1 == 0x6e) {
          iVar6 = __isoc99_fscanf(fp,"%lf",&local_38);
          if (iVar6 == 1) {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            *pTVar2 = local_38;
            uVar5 = 1;
          }
          else {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            (pTVar2->field_2).it = 0xffffffff;
            uVar5 = 0;
          }
        }
        else if ((bVar1 & 0xdf) == 0x4c) {
          uVar5 = io_file_readline(L,fp,(uint)(bVar1 == 0x6c));
        }
        else {
          if (bVar1 != 0x61) {
            lj_err_arg(L,iVar6 + 1,LJ_ERR_INVFMT);
          }
          uVar7 = 0;
          uVar14 = 0x2000;
          do {
            uVar16 = (ulong)(L->glref).ptr32;
            if (*(uint *)(uVar16 + 100) < uVar14) {
              MVar13 = 0x20;
              if (0x20 < uVar14) {
                MVar13 = uVar14;
              }
              pvVar8 = lj_mem_realloc(L,*(void **)(uVar16 + 0x58),*(uint *)(uVar16 + 100),MVar13);
              *(void **)(uVar16 + 0x58) = pvVar8;
              *(MSize *)(uVar16 + 100) = MVar13;
            }
            pcVar4 = *(char **)(uVar16 + 0x58);
            sVar9 = fread(pcVar4 + uVar7,1,(ulong)(uVar14 - (int)uVar7),(FILE *)fp);
            uVar15 = (int)uVar7 + (int)sVar9;
            uVar7 = (ulong)uVar15;
            bVar17 = uVar15 == uVar14;
            uVar14 = uVar14 * 2;
          } while (bVar17);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar4,(ulong)uVar15);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x24) <= *(uint *)(uVar7 + 0x20)) {
            lj_gc_step(L);
          }
        }
      }
      else {
        if (0xfffeffff < uVar14) goto LAB_0014653d;
        uVar5 = lj_lib_checkint(L,iVar6 + 1);
        if (uVar5 == 0) {
          iVar6 = getc((FILE *)fp);
          ungetc(iVar6,(FILE *)fp);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          (pTVar2->u32).lo = (L->glref).ptr32 + 0x80;
          (pTVar2->field_2).it = 0xfffffffb;
          bVar17 = iVar6 != -1;
        }
        else {
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 100) < uVar5) {
            MVar13 = 0x20;
            if (0x20 < uVar5) {
              MVar13 = uVar5;
            }
            pvVar8 = lj_mem_realloc(L,*(void **)(uVar7 + 0x58),*(uint *)(uVar7 + 100),MVar13);
            *(void **)(uVar7 + 0x58) = pvVar8;
            *(MSize *)(uVar7 + 100) = MVar13;
          }
          pcVar4 = *(char **)(uVar7 + 0x58);
          sVar9 = fread(pcVar4,1,(ulong)uVar5,(FILE *)fp);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar4,sVar9 & 0xffffffff);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x24) <= *(uint *)(uVar7 + 0x20)) {
            lj_gc_step(L);
          }
          bVar17 = (sVar9 & 0xffffffff) != 0;
        }
        uVar5 = (uint)bVar17;
      }
      iVar12 = iVar12 + -1;
      uVar11 = uVar11 + 1;
    } while ((iVar12 != 0) && (uVar5 != 0));
  }
  iVar12 = ferror((FILE *)fp);
  if (iVar12 == 0) {
    if (uVar5 == 0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
    }
    iVar12 = (int)uVar11 - start;
  }
  else {
    iVar12 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar12;
}

Assistant:

static int io_file_read(lua_State *L, FILE *fp, int start)
{
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] != '*')
	  lj_err_arg(L, n+1, LJ_ERR_INVOPT);
	if (p[1] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[1] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[1] == 'l'));
	else if (p[1] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}